

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ibuf::load(xr_ibuf *this,xr_reader *r,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint16_t *puVar3;
  size_t n_local;
  xr_reader *r_local;
  xr_ibuf *this_local;
  
  if (n == 0 || n % 3 != 0) {
    __assert_fail("n && (n%3 == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                  ,0x1d1,"void xray_re::xr_ibuf::load(xr_reader &, size_t)");
  }
  clear(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (uint16_t *)operator_new__(uVar2);
  this->m_indices = puVar3;
  xr_reader::r_cseq<unsigned_short>(r,n,this->m_indices);
  xr_flexbuf::set_size(&this->super_xr_flexbuf,n);
  return;
}

Assistant:

void xr_ibuf::load(xr_reader& r, size_t n)
{
	xr_assert(n && (n%3 == 0));
	clear();
	m_indices = new uint16_t[n];
	r.r_cseq(n, m_indices);
	set_size(n);
}